

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form4_RgbToBgr(RgbToBgrForm4 RgbToBgr)

{
  value_type vVar1;
  initializer_list<PenguinV_Image::ImageTemplate<unsigned_char>_> __l;
  byte bVar2;
  reference pvVar3;
  reference pvVar4;
  reference image_00;
  reference __a;
  reference __b;
  code *in_RDI;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  uint32_t in_stack_fffffffffffffdac;
  uint8_t in_stack_fffffffffffffdb6;
  uint8_t in_stack_fffffffffffffdb7;
  uint32_t in_stack_fffffffffffffdb8;
  uint32_t in_stack_fffffffffffffdbc;
  Image *in_stack_fffffffffffffdc0;
  uint8_t in_stack_fffffffffffffdcf;
  allocator_type *in_stack_fffffffffffffdd8;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffde0;
  iterator in_stack_fffffffffffffde8;
  size_type in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined8 in_stack_fffffffffffffe00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  uint32_t in_stack_fffffffffffffe08;
  uint32_t in_stack_fffffffffffffe0c;
  Image *in_stack_fffffffffffffe10;
  size_type sVar5;
  uint32_t *in_stack_fffffffffffffe18;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  undefined1 isAnyValue;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffe30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value;
  value_type y;
  value_type x;
  undefined1 **local_168;
  undefined4 local_148;
  undefined4 local_144;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_128;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_110;
  undefined1 local_f1;
  undefined8 *local_90;
  undefined1 *local_88 [5];
  undefined1 local_60 [40];
  undefined8 *local_38;
  undefined8 local_30;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_28;
  code *local_10;
  
  local_f1 = 1;
  local_90 = local_88;
  local_10 = in_RDI;
  Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8,
             in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb6);
  Test_Helper::uniformRGBImage(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc0);
  local_90 = (undefined8 *)local_60;
  Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8,
             in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb6);
  Test_Helper::uniformRGBImage(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc0);
  local_f1 = 0;
  local_38 = local_88;
  local_30 = 2;
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1e0d9f);
  __l._M_len = in_stack_fffffffffffffdf0;
  __l._M_array = in_stack_fffffffffffffde8;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector(in_stack_fffffffffffffde0,__l,in_stack_fffffffffffffdd8);
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::~allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1e0dd3);
  local_168 = (undefined1 **)&local_38;
  do {
    local_168 = local_168 + -5;
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x1e0e08);
  } while (local_168 != local_88);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e0e32);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e0e3f);
  Unit_Test::intensityArray(in_stack_fffffffffffffdac);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1e0e68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1e0e7d);
  Unit_Test::generateRoi
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,(uint32_t *)in_stack_fffffffffffffe10);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](&local_28,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_128,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_140,0);
  Unit_Test::fillImage
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08,
             (uint32_t)((ulong)in_stack_fffffffffffffe00 >> 0x20),
             (uint32_t)in_stack_fffffffffffffe00,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  sVar5 = 0;
  this_00 = &local_28;
  pvVar3 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this_00,0);
  this_01 = &local_128;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,sVar5);
  y = *pvVar4;
  this_02 = &local_140;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_02,sVar5);
  x = *pvVar4;
  value = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1;
  image_00 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[](this_00,1);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (this_01,(size_type)value);
  vVar1 = *pvVar4;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (this_02,(size_type)value);
  isAnyValue = (undefined1)((ulong)this_02 >> 0x38);
  (*local_10)(pvVar3,y,x,image_00,vVar1,*pvVar4,local_144,local_148);
  this = &local_110;
  __a = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,0);
  __b = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,2);
  std::swap<unsigned_char>(__a,__b);
  sVar5 = 1;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](&local_28,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_128,sVar5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_140,sVar5);
  bVar2 = Unit_Test::verifyImage
                    (image_00,x,y,(uint32_t)((ulong)pvVar3 >> 0x20),(uint32_t)pvVar3,value,
                     (bool)isAnyValue);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdc0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdc0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdc0);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)in_stack_fffffffffffffdc0);
  return (bool)(bVar2 & 1);
}

Assistant:

bool form4_RgbToBgr(RgbToBgrForm4 RgbToBgr)
    {
        std::vector < PenguinV_Image::Image > image = { uniformRGBImage( intensityValue() ), uniformRGBImage( intensityValue() ) };
        std::vector< uint8_t > intensity = intensityArray( 3 );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( image, roiX, roiY, roiWidth, roiHeight );

        fillImage( image[0], roiX[0], roiY[0], roiWidth, roiHeight, intensity );

        RgbToBgr( image[0], roiX[0], roiY[0], image[1], roiX[1], roiY[1], roiWidth, roiHeight );

        std::swap( intensity[0], intensity[2] );

        return verifyImage( image[1], roiX[1], roiY[1], roiWidth, roiHeight, intensity, false );
    }